

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  float fVar1;
  ImGuiDockNode *pIVar2;
  bool bVar3;
  float *pfVar4;
  long in_RCX;
  ImVec2 *in_RDX;
  ImGuiDockNode *in_RSI;
  ImGuiDockNode *in_RDI;
  byte in_R8B;
  byte in_R9B;
  ImGuiDir unaff_retaddr;
  ImRect *in_stack_00000008;
  float split_ratio;
  ImVec2 size_old;
  ImVec2 size_new;
  ImVec2 pos_old;
  ImVec2 pos_new;
  ImGuiAxis split_axis;
  ImGuiDir split_dir;
  int dir;
  ImGuiDockNodeFlags host_node_flags;
  ImGuiDockNode *ref_node_for_rect;
  ImGuiDockNode *root_payload_as_host;
  ImGuiContext *g;
  float local_dc;
  bool local_d2;
  byte local_d1;
  ImVec2 *local_d0;
  ImVec2 *local_c8;
  bool local_bf;
  byte local_be;
  byte local_bd;
  uint local_bc;
  ImGuiDockNode *local_b8;
  ImGuiDir dir_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 size_new_desired;
  ImVec2 local_68;
  uint local_60;
  uint local_5c;
  ImRect local_58;
  int local_48;
  uint local_44;
  ImGuiDockNode *local_40;
  ImVec2 local_38;
  ImGuiContext *local_30;
  byte local_22;
  byte local_21;
  long local_20;
  ImGuiDockNode *this;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_30 = GImGui;
  local_38 = in_RDX[0x83];
  local_b8 = in_RSI;
  local_20 = in_RCX;
  this = in_RSI;
  if ((in_RSI != (ImGuiDockNode *)0x0) && ((*(ushort *)&in_RSI->field_0xb0 >> 9 & 1) == 0)) {
    local_b8 = DockNodeGetRootNode(in_RSI);
  }
  local_40 = local_b8;
  if (this == (ImGuiDockNode *)0x0) {
    local_bc = 0;
  }
  else {
    local_bc = ImGuiDockNode::GetMergedFlags(this);
  }
  local_44 = local_bc;
  *(undefined1 *)(local_20 + 0xb9) = 1;
  if ((local_22 & 1) == 0) {
    if ((this == (ImGuiDockNode *)0x0) || ((local_bc & 0x10000) == 0)) {
      if ((this == (ImGuiDockNode *)0x0) ||
         (((local_bc & 4) == 0 || (bVar3 = ImGuiDockNode::IsCentralNode(this), !bVar3)))) {
        if (((this == (ImGuiDockNode *)0x0) || (bVar3 = ImGuiDockNode::IsEmpty(this), !bVar3)) &&
           (((local_38 != (ImVec2)0x0 &&
             (bVar3 = ImGuiDockNode::IsSplitNode((ImGuiDockNode *)local_38), bVar3)) &&
            (*(ImGuiDockNode **)((long)local_38 + 0x90) == (ImGuiDockNode *)0x0)))) {
          *(undefined1 *)(local_20 + 0xb9) = 0;
        }
      }
      else {
        *(undefined1 *)(local_20 + 0xb9) = 0;
      }
    }
    else {
      *(undefined1 *)(local_20 + 0xb9) = 0;
    }
  }
  else {
    *(undefined1 *)(local_20 + 0xb9) = 0;
  }
  *(undefined1 *)(local_20 + 0xba) = 1;
  if (((this == (ImGuiDockNode *)0x0) || ((local_44 & 0x10) == 0)) &&
     (((local_30->IO).ConfigDockingNoSplit & 1U) == 0)) {
    if ((((local_22 & 1) == 0) && (this != (ImGuiDockNode *)0x0)) &&
       ((this->ParentNode == (ImGuiDockNode *)0x0 &&
        (bVar3 = ImGuiDockNode::IsCentralNode(this), bVar3)))) {
      *(undefined1 *)(local_20 + 0xba) = 0;
    }
  }
  else {
    *(undefined1 *)(local_20 + 0xba) = 0;
  }
  dir_00 = (ImGuiDir)((ulong)in_RSI >> 0x20);
  if (this == (ImGuiDockNode *)0x0) {
    local_bd = (byte)in_RDI[1].ID;
  }
  else {
    local_bd = (byte)((ushort)*(undefined2 *)&this->field_0xb0 >> 0xb) & 1;
  }
  local_be = 1;
  if ((local_bd & 1) == 0) {
    local_be = *(byte *)&in_RDX[0x17].x;
  }
  *(ushort *)(local_20 + 0xb0) =
       *(ushort *)(local_20 + 0xb0) & 0xf7ff | (ushort)(local_be & 1) << 0xb;
  if (this == (ImGuiDockNode *)0x0) {
    local_bf = (*(uint *)&in_RDI->field_0xc & 0x20) == 0;
  }
  else {
    local_bf = true;
  }
  *(ushort *)(local_20 + 0xb0) = *(ushort *)(local_20 + 0xb0) & 0xefff | (ushort)local_bf << 0xc;
  pIVar2 = in_RDI;
  if (this != (ImGuiDockNode *)0x0) {
    pIVar2 = local_40;
  }
  local_c8 = &pIVar2->Pos;
  *(ImVec2 *)(local_20 + 0x40) = *local_c8;
  pIVar2 = in_RDI;
  if (this != (ImGuiDockNode *)0x0) {
    pIVar2 = local_40;
  }
  local_d0 = &pIVar2->Size;
  *(ImVec2 *)(local_20 + 0x48) = *local_d0;
  *(ImGuiDockNode **)(local_20 + 0xc0) = this;
  *(undefined4 *)(local_20 + 200) = 0xffffffff;
  *(undefined1 *)(local_20 + 0xbb) = 0;
  if ((in_RDI->field_0xb2 & 1) == 0) {
    for (local_48 = -1; dir_00 = (ImGuiDir)((ulong)in_RSI >> 0x20), local_48 < 4;
        local_48 = local_48 + 1) {
      if (((local_48 != -1) || ((*(byte *)(local_20 + 0xb9) & 1) != 0)) &&
         ((local_48 == -1 || ((*(byte *)(local_20 + 0xba) & 1) != 0)))) {
        local_58 = ImGuiDockNode::Rect((ImGuiDockNode *)0x1c8406);
        bVar3 = DockNodeCalcDropRectsAndTestMousePos
                          (in_stack_00000008,unaff_retaddr,(ImRect *)in_RDI,
                           SUB81((ulong)this >> 0x38,0),in_RDX);
        if (bVar3) {
          *(int *)(local_20 + 200) = local_48;
          *(undefined1 *)(local_20 + 0xbb) = 1;
        }
      }
    }
  }
  local_d1 = 1;
  if (*(int *)(local_20 + 200) == -1) {
    local_d1 = *(byte *)(local_20 + 0xb9);
  }
  *(byte *)(local_20 + 0xb8) = local_d1 & 1;
  if ((((local_21 & 1) == 0) && ((*(byte *)(local_20 + 0xbb) & 1) == 0)) &&
     (((local_30->IO).ConfigDockingWithShift & 1U) == 0)) {
    *(undefined1 *)(local_20 + 0xb8) = 0;
  }
  *(undefined4 *)(local_20 + 0xcc) = 0;
  if (*(int *)(local_20 + 200) != -1) {
    local_5c = *(uint *)(local_20 + 200);
    local_d2 = local_5c < 2;
    local_60 = (byte)~local_d2 & 1;
    ImVec2::ImVec2(&local_68);
    size_new_desired = *(ImVec2 *)(local_20 + 0x40);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88);
    DockNodeCalcSplitRects
              ((ImVec2 *)in_stack_ffffffffffffff88,*(ImVec2 **)(local_20 + 0x48),(ImVec2 *)in_RDX[9]
               ,(ImVec2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),dir_00,
               size_new_desired);
    pfVar4 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffff88,(long)(int)local_60);
    fVar1 = *pfVar4;
    pfVar4 = ImVec2::operator[]((ImVec2 *)(local_20 + 0x48),(long)(int)local_60);
    local_dc = ImSaturate(fVar1 / *pfVar4);
    *(ImVec2 *)(local_20 + 0x40) = local_68;
    *(ImVec2 *)(local_20 + 0x48) = in_stack_ffffffffffffff88;
    if ((local_5c == 1) || (local_5c == 3)) {
      local_dc = 1.0 - local_dc;
    }
    *(float *)(local_20 + 0xcc) = local_dc;
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags host_node_flags = host_node ? host_node->GetMergedFlags() : 0;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDocking))
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((host_node && (host_node_flags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = host_node ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = host_node ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}